

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O2

json_null __thiscall json_deserializer::deserialize_null(json_deserializer *this)

{
  ulong uVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  ulong uVar4;
  ostream *poVar5;
  int iVar6;
  int *in_RSI;
  size_type sVar7;
  bool bVar8;
  string str;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&str,*(char *)(*(long *)(in_RSI + 2) + (long)*in_RSI));
  iVar6 = 3;
  while (sVar3 = str._M_string_length, _Var2._M_p = str._M_dataplus._M_p, bVar8 = iVar6 != 0,
        iVar6 = iVar6 + -1, bVar8) {
    uVar1 = (long)*in_RSI + 1;
    uVar4 = (long)*in_RSI;
    if (uVar1 < *(ulong *)(in_RSI + 4)) {
      *in_RSI = (int)uVar1;
      uVar4 = uVar1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&str,*(char *)(*(long *)(in_RSI + 2) + uVar4));
  }
  for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
    iVar6 = tolower((int)_Var2._M_p[sVar7]);
    _Var2._M_p[sVar7] = (char)iVar6;
  }
  bVar8 = std::operator==(&str,"null");
  if (!bVar8) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Expected \'null\', found ");
    poVar5 = std::operator<<(poVar5,(string *)&str);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  *(undefined ***)&this->reader = &PTR_get_type_00136a50;
  std::__cxx11::string::~string((string *)&str);
  return (json_null)(json_element)this;
}

Assistant:

json_null deserialize_null() {
        string str;
        str += reader.current();
        int i = 1;
        while (i < 4) {
            reader.next();
            str += reader.current();
            i++;
        }
        transform(str.begin(), str.end(), str.begin(), ::tolower);
        if (str != "null") {
            cerr << "Expected 'null', found " << str << endl;
        }
        return json_null_instance;
    }